

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_mame.c
# Opt level: O3

void qsound_write_data(void *info,UINT8 address,UINT16 data)

{
  uint uVar1;
  uint uVar2;
  undefined7 in_register_00000031;
  ulong uVar3;
  
  uVar3 = CONCAT71(in_register_00000031,address);
  if ((char)address < '\0') {
    if (address < 0x90) {
      uVar3 = (ulong)((uint)uVar3 & 0xf);
      uVar2 = data & 0x3f;
      if (0x2f < (ushort)uVar2) {
        uVar2 = 0x30;
      }
      uVar1 = 0x10;
      if (0x10 < (ushort)uVar2) {
        uVar1 = uVar2;
      }
      *(undefined4 *)((long)info + uVar3 * 0x24 + 0x20) =
           *(undefined4 *)((long)info + (ulong)(uVar1 - 0x10) * 4 + 600);
      *(undefined4 *)((long)info + uVar3 * 0x24 + 0x1c) =
           *(undefined4 *)((long)info + (ulong)(0x30 - uVar1) * 4 + 600);
      return;
    }
    uVar2 = 0;
    if ((byte)(address + 0x46) < 0x10) {
      return;
    }
  }
  else {
    uVar2 = (uint)(uVar3 >> 3) & 0x1fffffff;
    uVar3 = (ulong)(address & 7);
  }
  switch(uVar3 & 0xff) {
  case 0:
    *(uint *)((long)info + (ulong)(uVar2 + 1 & 0xf) * 0x24 + 8) = (uint)data << 0x10;
    return;
  case 1:
    *(uint *)((long)info + (ulong)uVar2 * 0x24 + 0xc) = (uint)data;
    return;
  case 2:
    *(uint *)((long)info + (ulong)uVar2 * 0x24 + 0x14) = (uint)data;
    return;
  case 3:
    *(byte *)((long)info + (ulong)uVar2 * 0x24 + 0x1a) = (byte)(data >> 0xf);
    *(undefined4 *)((long)info + (ulong)uVar2 * 0x24 + 0x24) = 0;
    return;
  case 4:
    *(UINT16 *)((long)info + (ulong)uVar2 * 0x24 + 0x10) = data;
    return;
  case 5:
    *(UINT16 *)((long)info + (ulong)uVar2 * 0x24 + 0x12) = data;
    return;
  case 6:
    *(UINT16 *)((long)info + (ulong)uVar2 * 0x24 + 0x18) = data;
    return;
  default:
    return;
  }
}

Assistant:

static void qsound_write_data(void *info, UINT8 address, UINT16 data)
{
	qsound_state *chip = (qsound_state *)info;
	int ch = 0, reg = 0;

	// direct sound reg
	if (address < 0x80)
	{
		ch = address >> 3;
		reg = address & 7;
	}

	// >= 0x80 is probably for the dsp?
	else if (address < 0x90)
	{
		ch = address & 0xf;
		reg = 8;
	}
	else if (address >= 0xba && address < 0xca)
	{
		ch = address - 0xba;
		reg = 9;
	}
	else
	{
		// unknown
		reg = address;
	}

	switch (reg)
	{
		case 0:
			// bank, high bits unknown
			ch = (ch + 1) & 0xf; // strange ...
			chip->channel[ch].bank = data << 16;
			break;

		case 1:
			// start/cur address
			chip->channel[ch].address = data;
			break;

		case 2:
			// frequency
			chip->channel[ch].freq = data;
#if 0
			if (data == 0)
			{
				// key off
				chip->channel[ch].enabled = 0;
			}
#endif
			break;

		case 3:
			// key on (does the value matter? it always writes 0x8000)
			chip->channel[ch].enabled = (data & 0x8000) >> 15;
			chip->channel[ch].step_ptr = 0;
			break;

		case 4:
			// loop address
			chip->channel[ch].loop = data;
			break;

		case 5:
			// end address
			chip->channel[ch].end = data;
			break;

		case 6:
			// master volume
			chip->channel[ch].vol = data;
			break;

		case 7:
			// unused?
			break;

		case 8:
		{
			// panning (left=0x0110, centre=0x0120, right=0x0130)
			// looks like it doesn't write other values than that
			int pan = (data & 0x3f) - 0x10;
			if (pan > 0x20)
				pan = 0x20;
			if (pan < 0)
				pan = 0;
			
			chip->channel[ch].rvol = chip->pan_table[pan];
			chip->channel[ch].lvol = chip->pan_table[0x20 - pan];
			break;
		}

		case 9:
			// unknown
			break;

		default:
			//logerror("%s: write_data %02x = %04x\n", machine().describe_context(), address, data);
			break;
	}
}